

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRRLoader.cpp
# Opt level: O2

void __thiscall
Assimp::IRRImporter::BuildSkybox
          (IRRImporter *this,vector<aiMesh_*,_std::allocator<aiMesh_*>_> *meshes,
          vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *materials)

{
  IRRImporter *this_00;
  ai_uint32 aVar1;
  IRRImporter *pIVar2;
  uint i;
  long lVar3;
  aiMesh *local_4d8;
  IRRImporter *local_4d0;
  int shading;
  float fStack_4c4;
  float fStack_4c0;
  float fStack_4bc;
  float local_4b8;
  float fStack_4b4;
  aiVector3D aaStack_4b0 [2];
  SkyboxVertex local_498;
  SkyboxVertex local_468;
  aiString s;
  
  local_4d0 = (IRRImporter *)meshes;
  for (lVar3 = 0; lVar3 != 6; lVar3 = lVar3 + 1) {
    this = (IRRImporter *)
           (materials->super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>)._M_impl.
           super__Vector_impl_data._M_finish[lVar3 + -6];
    s._0_8_ = s._0_8_ & 0xffffff0000000000;
    memset(s.data + 1,0x1b,0x3ff);
    aVar1 = snprintf(s.data,0x400,"SkyboxSide_%u");
    s.length = aVar1;
    aiMaterial::AddProperty((aiMaterial *)this,&s,"?mat.name",0,0);
    shading = 9;
    aiMaterial::AddProperty((aiMaterial *)this,&shading,1,"$mat.shadingm",0,0);
  }
  s.length = 0xc1200000;
  s.data[0] = '\0';
  s.data[1] = '\0';
  s.data[2] = ' ';
  s.data[3] = -0x3f;
  s.data[4] = '\0';
  s.data[5] = '\0';
  s.data[6] = ' ';
  s.data[7] = -0x3f;
  s.data[8] = '\0';
  s.data[9] = '\0';
  s.data[10] = '\0';
  s.data[0xb] = '\0';
  s.data[0xc] = '\0';
  s.data[0xd] = '\0';
  s.data[0xe] = '\0';
  s.data[0xf] = '\0';
  s.data[0x10] = '\0';
  s.data[0x11] = '\0';
  s.data[0x12] = -0x80;
  s.data[0x13] = '?';
  s.data[0x14] = '\0';
  s.data[0x15] = '\0';
  s.data[0x16] = -0x80;
  s.data[0x17] = '?';
  s.data[0x18] = '\0';
  s.data[0x19] = '\0';
  s.data[0x1a] = -0x80;
  s.data[0x1b] = '?';
  s.data[0x1c] = '\0';
  s.data[0x1d] = '\0';
  s.data[0x1e] = '\0';
  s.data[0x1f] = '\0';
  shading = 0x41200000;
  fStack_4c4 = -10.0;
  fStack_4c0 = -10.0;
  fStack_4bc = 0.0;
  local_4b8 = 0.0;
  fStack_4b4 = 1.0;
  aaStack_4b0[0].x = 0.0;
  aaStack_4b0[0].y = 1.0;
  aaStack_4b0[0].z = 0.0;
  local_468.position.x = 10.0;
  local_468.position.y = 10.0;
  local_468.position.z = -10.0;
  local_468.normal.x = 0.0;
  local_468.normal.y = 0.0;
  local_468.normal.z = 1.0;
  local_468.uv.x = 0.0;
  local_468.uv.y = 0.0;
  local_468.uv.z = 0.0;
  local_498.position.x = -10.0;
  local_498.position.y = 10.0;
  local_498.position.z = -10.0;
  local_498.normal.x = 0.0;
  local_498.normal.y = 0.0;
  local_498.normal.z = 1.0;
  local_498.uv.x = 1.0;
  local_498.uv.y = 0.0;
  local_498.uv.z = 0.0;
  local_4d8 = BuildSingleQuadMesh(this,(SkyboxVertex *)&s,(SkyboxVertex *)&shading,&local_468,
                                  &local_498);
  this_00 = local_4d0;
  pIVar2 = local_4d0;
  std::vector<aiMesh*,std::allocator<aiMesh*>>::emplace_back<aiMesh*>
            ((vector<aiMesh*,std::allocator<aiMesh*>> *)local_4d0,&local_4d8);
  *(int *)(*(long *)(*(long *)&(this_00->super_BaseImporter).importerUnits._M_t._M_impl + -8) + 0xe8
          ) = (int)((ulong)((long)(materials->
                                  super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>).
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)(materials->
                                 super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>).
                                 _M_impl.super__Vector_impl_data._M_start) >> 3) + -6;
  s.length = 0x41200000;
  s.data[0] = '\0';
  s.data[1] = '\0';
  s.data[2] = ' ';
  s.data[3] = -0x3f;
  s.data[4] = '\0';
  s.data[5] = '\0';
  s.data[6] = ' ';
  s.data[7] = -0x3f;
  s.data[8] = '\0';
  s.data[9] = '\0';
  s.data[10] = -0x80;
  s.data[0xb] = -0x41;
  s.data[0xc] = '\0';
  s.data[0xd] = '\0';
  s.data[0xe] = '\0';
  s.data[0xf] = '\0';
  s.data[0x10] = '\0';
  s.data[0x11] = '\0';
  s.data[0x12] = '\0';
  s.data[0x13] = '\0';
  s.data[0x14] = '\0';
  s.data[0x15] = '\0';
  s.data[0x16] = -0x80;
  s.data[0x17] = '?';
  s.data[0x18] = '\0';
  s.data[0x19] = '\0';
  s.data[0x1a] = -0x80;
  s.data[0x1b] = '?';
  s.data[0x1c] = '\0';
  s.data[0x1d] = '\0';
  s.data[0x1e] = '\0';
  s.data[0x1f] = '\0';
  shading = 0x41200000;
  fStack_4c4 = -10.0;
  fStack_4c0 = 10.0;
  fStack_4bc = -1.0;
  local_4b8 = 0.0;
  fStack_4b4 = 0.0;
  aaStack_4b0[0].x = 0.0;
  aaStack_4b0[0].y = 1.0;
  aaStack_4b0[0].z = 0.0;
  local_468.position.x = 10.0;
  local_468.position.y = 10.0;
  local_468.position.z = 10.0;
  local_468.normal.x = -1.0;
  local_468.uv.z = 0.0;
  local_468.normal.y = 0.0;
  local_468.normal.z = 0.0;
  local_468.uv.x = 0.0;
  local_468.uv.y = 0.0;
  local_498.position.x = 10.0;
  local_498.position.y = 10.0;
  local_498.position.z = -10.0;
  local_498.normal.x = -1.0;
  local_498.normal.y = 0.0;
  local_498.normal.z = 0.0;
  local_498.uv.x = 1.0;
  local_498.uv.y = 0.0;
  local_498.uv.z = 0.0;
  local_4d8 = BuildSingleQuadMesh(pIVar2,(SkyboxVertex *)&s,(SkyboxVertex *)&shading,&local_468,
                                  &local_498);
  pIVar2 = this_00;
  std::vector<aiMesh*,std::allocator<aiMesh*>>::emplace_back<aiMesh*>
            ((vector<aiMesh*,std::allocator<aiMesh*>> *)this_00,&local_4d8);
  *(int *)(*(long *)(*(long *)&(this_00->super_BaseImporter).importerUnits._M_t._M_impl + -8) + 0xe8
          ) = (int)((ulong)((long)(materials->
                                  super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>).
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)(materials->
                                 super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>).
                                 _M_impl.super__Vector_impl_data._M_start) >> 3) + -5;
  s.length = 0x41200000;
  s.data[0] = '\0';
  s.data[1] = '\0';
  s.data[2] = ' ';
  s.data[3] = -0x3f;
  s.data[4] = '\0';
  s.data[5] = '\0';
  s.data[6] = ' ';
  s.data[7] = 'A';
  s.data[8] = '\0';
  s.data[9] = '\0';
  s.data[10] = '\0';
  s.data[0xb] = '\0';
  s.data[0xc] = '\0';
  s.data[0xd] = '\0';
  s.data[0xe] = '\0';
  s.data[0xf] = '\0';
  s.data[0x10] = '\0';
  s.data[0x11] = '\0';
  s.data[0x12] = -0x80;
  s.data[0x13] = -0x41;
  s.data[0x14] = '\0';
  s.data[0x15] = '\0';
  s.data[0x16] = -0x80;
  s.data[0x17] = '?';
  s.data[0x18] = '\0';
  s.data[0x19] = '\0';
  s.data[0x1a] = -0x80;
  s.data[0x1b] = '?';
  s.data[0x1c] = '\0';
  s.data[0x1d] = '\0';
  s.data[0x1e] = '\0';
  s.data[0x1f] = '\0';
  shading = -0x3ee00000;
  fStack_4c4 = -10.0;
  fStack_4c0 = 10.0;
  fStack_4bc = 0.0;
  local_4b8 = 0.0;
  fStack_4b4 = -1.0;
  aaStack_4b0[0].x = 0.0;
  aaStack_4b0[0].y = 1.0;
  aaStack_4b0[0].z = 0.0;
  local_468.position.x = -10.0;
  local_468.position.y = 10.0;
  local_468.position.z = 10.0;
  local_468.normal.x = 0.0;
  local_468.normal.y = 0.0;
  local_468.normal.z = -1.0;
  local_468.uv.x = 0.0;
  local_468.uv.y = 0.0;
  local_468.uv.z = 0.0;
  local_498.position.x = 10.0;
  local_498.position.y = 10.0;
  local_498.position.z = 10.0;
  local_498.normal.x = 0.0;
  local_498.normal.y = 0.0;
  local_498.normal.z = -1.0;
  local_498.uv.x = 1.0;
  local_498.uv.y = 0.0;
  local_498.uv.z = 0.0;
  local_4d8 = BuildSingleQuadMesh(pIVar2,(SkyboxVertex *)&s,(SkyboxVertex *)&shading,&local_468,
                                  &local_498);
  pIVar2 = this_00;
  std::vector<aiMesh*,std::allocator<aiMesh*>>::emplace_back<aiMesh*>
            ((vector<aiMesh*,std::allocator<aiMesh*>> *)this_00,&local_4d8);
  *(int *)(*(long *)(*(long *)&(this_00->super_BaseImporter).importerUnits._M_t._M_impl + -8) + 0xe8
          ) = (int)((ulong)((long)(materials->
                                  super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>).
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)(materials->
                                 super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>).
                                 _M_impl.super__Vector_impl_data._M_start) >> 3) + -4;
  s.length = 0xc1200000;
  s.data[0] = '\0';
  s.data[1] = '\0';
  s.data[2] = ' ';
  s.data[3] = -0x3f;
  s.data[4] = '\0';
  s.data[5] = '\0';
  s.data[6] = ' ';
  s.data[7] = 'A';
  s.data[8] = '\0';
  s.data[9] = '\0';
  s.data[10] = -0x80;
  s.data[0xb] = '?';
  s.data[0xc] = '\0';
  s.data[0xd] = '\0';
  s.data[0xe] = '\0';
  s.data[0xf] = '\0';
  s.data[0x10] = '\0';
  s.data[0x11] = '\0';
  s.data[0x12] = '\0';
  s.data[0x13] = '\0';
  s.data[0x14] = '\0';
  s.data[0x15] = '\0';
  s.data[0x16] = -0x80;
  s.data[0x17] = '?';
  s.data[0x18] = '\0';
  s.data[0x19] = '\0';
  s.data[0x1a] = -0x80;
  s.data[0x1b] = '?';
  s.data[0x1c] = '\0';
  s.data[0x1d] = '\0';
  s.data[0x1e] = '\0';
  s.data[0x1f] = '\0';
  shading = -0x3ee00000;
  fStack_4c4 = -10.0;
  fStack_4c0 = -10.0;
  fStack_4bc = 1.0;
  local_4b8 = 0.0;
  fStack_4b4 = 0.0;
  aaStack_4b0[0].x = 0.0;
  aaStack_4b0[0].y = 1.0;
  aaStack_4b0[0].z = 0.0;
  local_468.position.x = -10.0;
  local_468.position.y = 10.0;
  local_468.position.z = -10.0;
  local_468.normal.x = 1.0;
  local_468.uv.z = 0.0;
  local_468.normal.y = 0.0;
  local_468.normal.z = 0.0;
  local_468.uv.x = 0.0;
  local_468.uv.y = 0.0;
  local_498.position.x = -10.0;
  local_498.position.y = 10.0;
  local_498.position.z = 10.0;
  local_498.normal.x = 1.0;
  local_498.normal.y = 0.0;
  local_498.normal.z = 0.0;
  local_498.uv.x = 1.0;
  local_498.uv.y = 0.0;
  local_498.uv.z = 0.0;
  local_4d8 = BuildSingleQuadMesh(pIVar2,(SkyboxVertex *)&s,(SkyboxVertex *)&shading,&local_468,
                                  &local_498);
  pIVar2 = this_00;
  std::vector<aiMesh*,std::allocator<aiMesh*>>::emplace_back<aiMesh*>
            ((vector<aiMesh*,std::allocator<aiMesh*>> *)this_00,&local_4d8);
  *(int *)(*(long *)(*(long *)&(this_00->super_BaseImporter).importerUnits._M_t._M_impl + -8) + 0xe8
          ) = (int)((ulong)((long)(materials->
                                  super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>).
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)(materials->
                                 super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>).
                                 _M_impl.super__Vector_impl_data._M_start) >> 3) + -3;
  s.length = 0x41200000;
  s.data[0] = '\0';
  s.data[1] = '\0';
  s.data[2] = ' ';
  s.data[3] = 'A';
  s.data[4] = '\0';
  s.data[5] = '\0';
  s.data[6] = ' ';
  s.data[7] = -0x3f;
  s.data[8] = '\0';
  s.data[9] = '\0';
  s.data[10] = '\0';
  s.data[0xb] = '\0';
  s.data[0xc] = '\0';
  s.data[0xd] = '\0';
  s.data[0xe] = -0x80;
  s.data[0xf] = -0x41;
  s.data[0x10] = '\0';
  s.data[0x11] = '\0';
  s.data[0x12] = '\0';
  s.data[0x13] = '\0';
  s.data[0x14] = '\0';
  s.data[0x15] = '\0';
  s.data[0x16] = -0x80;
  s.data[0x17] = '?';
  s.data[0x18] = '\0';
  s.data[0x19] = '\0';
  s.data[0x1a] = -0x80;
  s.data[0x1b] = '?';
  s.data[0x1c] = '\0';
  s.data[0x1d] = '\0';
  s.data[0x1e] = '\0';
  s.data[0x1f] = '\0';
  shading = 0x41200000;
  fStack_4c4 = 10.0;
  fStack_4c0 = 10.0;
  fStack_4bc = 0.0;
  local_4b8 = -1.0;
  fStack_4b4 = 0.0;
  aaStack_4b0[0].x = 0.0;
  aaStack_4b0[0].y = 1.0;
  aaStack_4b0[0].z = 0.0;
  local_468.position.x = -10.0;
  local_468.position.y = 10.0;
  local_468.position.z = 10.0;
  local_468.normal.x = 0.0;
  local_468.normal.y = -1.0;
  local_468.normal.z = 0.0;
  local_468.uv.x = 0.0;
  local_468.uv.y = 0.0;
  local_468.uv.z = 0.0;
  local_498.position.x = -10.0;
  local_498.position.y = 10.0;
  local_498.position.z = -10.0;
  local_498.normal.x = 0.0;
  local_498.normal.y = -1.0;
  local_498.normal.z = 0.0;
  local_498.uv.x = 1.0;
  local_498.uv.y = 0.0;
  local_498.uv.z = 0.0;
  local_4d8 = BuildSingleQuadMesh(pIVar2,(SkyboxVertex *)&s,(SkyboxVertex *)&shading,&local_468,
                                  &local_498);
  pIVar2 = this_00;
  std::vector<aiMesh*,std::allocator<aiMesh*>>::emplace_back<aiMesh*>
            ((vector<aiMesh*,std::allocator<aiMesh*>> *)this_00,&local_4d8);
  *(int *)(*(long *)(*(long *)&(this_00->super_BaseImporter).importerUnits._M_t._M_impl + -8) + 0xe8
          ) = (int)((ulong)((long)(materials->
                                  super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>).
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)(materials->
                                 super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>).
                                 _M_impl.super__Vector_impl_data._M_start) >> 3) + -2;
  shading = 0x41200000;
  fStack_4c4 = -10.0;
  fStack_4c0 = -10.0;
  fStack_4bc = 0.0;
  local_4b8 = 1.0;
  fStack_4b4 = 0.0;
  aaStack_4b0[0].x = 1.0;
  aaStack_4b0[0].y = 0.0;
  aaStack_4b0[0].z = 0.0;
  s.length = 0x41200000;
  s.data[0] = '\0';
  s.data[1] = '\0';
  s.data[2] = ' ';
  s.data[3] = -0x3f;
  s.data[4] = '\0';
  s.data[5] = '\0';
  s.data[6] = ' ';
  s.data[7] = 'A';
  s.data[8] = '\0';
  s.data[9] = '\0';
  s.data[10] = '\0';
  s.data[0xb] = '\0';
  local_468.position.x = -10.0;
  local_468.position.y = -10.0;
  local_468.position.z = -10.0;
  local_468.normal.x = 0.0;
  local_468.normal.y = 1.0;
  local_468.normal.z = 0.0;
  local_468.uv.x = 1.0;
  local_468.uv.y = 1.0;
  local_468.uv.z = 0.0;
  s.data[0xc] = '\0';
  s.data[0xd] = '\0';
  s.data[0xe] = -0x80;
  s.data[0xf] = '?';
  s.data[0x10] = '\0';
  s.data[0x11] = '\0';
  s.data[0x12] = '\0';
  s.data[0x13] = '\0';
  s.data[0x14] = '\0';
  s.data[0x15] = '\0';
  s.data[0x16] = '\0';
  s.data[0x17] = '\0';
  s.data[0x18] = '\0';
  s.data[0x19] = '\0';
  s.data[0x1a] = '\0';
  s.data[0x1b] = '\0';
  s.data[0x1c] = '\0';
  s.data[0x1d] = '\0';
  s.data[0x1e] = '\0';
  s.data[0x1f] = '\0';
  local_498.position.x = -10.0;
  local_498.position.y = -10.0;
  local_498.position.z = 10.0;
  local_498.normal.x = 0.0;
  local_498.normal.y = 1.0;
  local_498.normal.z = 0.0;
  local_498.uv.x = 0.0;
  local_498.uv.y = 1.0;
  local_498.uv.z = 0.0;
  local_4d8 = BuildSingleQuadMesh(pIVar2,(SkyboxVertex *)&s,(SkyboxVertex *)&shading,&local_468,
                                  &local_498);
  std::vector<aiMesh*,std::allocator<aiMesh*>>::emplace_back<aiMesh*>
            ((vector<aiMesh*,std::allocator<aiMesh*>> *)this_00,&local_4d8);
  *(int *)(*(long *)(*(long *)&(this_00->super_BaseImporter).importerUnits._M_t._M_impl + -8) + 0xe8
          ) = (int)((ulong)((long)(materials->
                                  super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>).
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)(materials->
                                 super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>).
                                 _M_impl.super__Vector_impl_data._M_start) >> 3) + -1;
  return;
}

Assistant:

void IRRImporter::BuildSkybox(std::vector<aiMesh*>& meshes, std::vector<aiMaterial*> materials)
{
    // Update the material of the skybox - replace the name and disable shading for skyboxes.
    for (unsigned int i = 0; i < 6;++i) {
        aiMaterial* out = ( aiMaterial* ) (*(materials.end()-(6-i)));

        aiString s;
        s.length = ::ai_snprintf( s.data, MAXLEN, "SkyboxSide_%u",i );
        out->AddProperty(&s,AI_MATKEY_NAME);

        int shading = aiShadingMode_NoShading;
        out->AddProperty(&shading,1,AI_MATKEY_SHADING_MODEL);
    }

    // Skyboxes are much more difficult. They are represented
    // by six single planes with different textures, so we'll
    // need to build six meshes.

    const ai_real l = 10.0; // the size used by Irrlicht

    // FRONT SIDE
    meshes.push_back( BuildSingleQuadMesh(
        SkyboxVertex(-l,-l,-l,  0, 0, 1,   1.0,1.0),
        SkyboxVertex( l,-l,-l,  0, 0, 1,   0.0,1.0),
        SkyboxVertex( l, l,-l,  0, 0, 1,   0.0,0.0),
        SkyboxVertex(-l, l,-l,  0, 0, 1,   1.0,0.0)) );
    meshes.back()->mMaterialIndex = static_cast<unsigned int>(materials.size()-6u);

    // LEFT SIDE
    meshes.push_back( BuildSingleQuadMesh(
        SkyboxVertex( l,-l,-l,  -1, 0, 0,   1.0,1.0),
        SkyboxVertex( l,-l, l,  -1, 0, 0,   0.0,1.0),
        SkyboxVertex( l, l, l,  -1, 0, 0,   0.0,0.0),
        SkyboxVertex( l, l,-l,  -1, 0, 0,   1.0,0.0)) );
    meshes.back()->mMaterialIndex = static_cast<unsigned int>(materials.size()-5u);

    // BACK SIDE
    meshes.push_back( BuildSingleQuadMesh(
        SkyboxVertex( l,-l, l,  0, 0, -1,   1.0,1.0),
        SkyboxVertex(-l,-l, l,  0, 0, -1,   0.0,1.0),
        SkyboxVertex(-l, l, l,  0, 0, -1,   0.0,0.0),
        SkyboxVertex( l, l, l,  0, 0, -1,   1.0,0.0)) );
    meshes.back()->mMaterialIndex = static_cast<unsigned int>(materials.size()-4u);

    // RIGHT SIDE
    meshes.push_back( BuildSingleQuadMesh(
        SkyboxVertex(-l,-l, l,  1, 0, 0,   1.0,1.0),
        SkyboxVertex(-l,-l,-l,  1, 0, 0,   0.0,1.0),
        SkyboxVertex(-l, l,-l,  1, 0, 0,   0.0,0.0),
        SkyboxVertex(-l, l, l,  1, 0, 0,   1.0,0.0)) );
    meshes.back()->mMaterialIndex = static_cast<unsigned int>(materials.size()-3u);

    // TOP SIDE
    meshes.push_back( BuildSingleQuadMesh(
        SkyboxVertex( l, l,-l,  0, -1, 0,   1.0,1.0),
        SkyboxVertex( l, l, l,  0, -1, 0,   0.0,1.0),
        SkyboxVertex(-l, l, l,  0, -1, 0,   0.0,0.0),
        SkyboxVertex(-l, l,-l,  0, -1, 0,   1.0,0.0)) );
    meshes.back()->mMaterialIndex = static_cast<unsigned int>(materials.size()-2u);

    // BOTTOM SIDE
    meshes.push_back( BuildSingleQuadMesh(
        SkyboxVertex( l,-l, l,  0,  1, 0,   0.0,0.0),
        SkyboxVertex( l,-l,-l,  0,  1, 0,   1.0,0.0),
        SkyboxVertex(-l,-l,-l,  0,  1, 0,   1.0,1.0),
        SkyboxVertex(-l,-l, l,  0,  1, 0,   0.0,1.0)) );
    meshes.back()->mMaterialIndex = static_cast<unsigned int>(materials.size()-1u);
}